

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

void __thiscall
TPZSkylMatrix<double>::Write(TPZSkylMatrix<double> *this,TPZStream *buf,int withclassid)

{
  int64_t iVar1;
  TPZBaseMatrix *in_RDI;
  int64_t i;
  double *ptr;
  TPZVec<long> skyl;
  TPZVec<long> *in_stack_ffffffffffffff60;
  TPZVec<double> *in_stack_ffffffffffffff68;
  TPZBaseMatrix *in_stack_ffffffffffffff70;
  long local_60;
  double *local_48;
  TPZVec<long> local_38;
  
  TPZBaseMatrix::Write
            (in_stack_ffffffffffffff70,(TPZStream *)in_stack_ffffffffffffff68,
             (int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
  TPZStream::Write<double>((TPZStream *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  TPZBaseMatrix::Rows(in_RDI);
  TPZVec<long>::TPZVec
            ((TPZVec<long> *)in_stack_ffffffffffffff70,(int64_t)in_stack_ffffffffffffff68,
             (long *)in_stack_ffffffffffffff60);
  local_48 = (double *)0x0;
  iVar1 = TPZBaseMatrix::Rows(in_RDI);
  if (iVar1 != 0) {
    local_48 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 2),0);
  }
  local_60 = 0;
  while( true ) {
    iVar1 = TPZBaseMatrix::Rows(in_RDI);
    if (iVar1 + 1 <= local_60) break;
    in_stack_ffffffffffffff70 =
         (TPZBaseMatrix *)TPZVec<double_*>::operator[]((TPZVec<double_*> *)(in_RDI + 1),local_60);
    in_stack_ffffffffffffff60 =
         (TPZVec<long> *)
         ((long)(in_stack_ffffffffffffff70->super_TPZSavable)._vptr_TPZSavable - (long)local_48 >> 3
         );
    in_stack_ffffffffffffff68 = (TPZVec<double> *)TPZVec<long>::operator[](&local_38,local_60);
    in_stack_ffffffffffffff68->_vptr_TPZVec = (_func_int **)in_stack_ffffffffffffff60;
    local_60 = local_60 + 1;
  }
  TPZStream::Write<long>
            ((TPZStream *)in_stack_ffffffffffffff70,(TPZVec<long> *)in_stack_ffffffffffffff68);
  TPZVec<long>::~TPZVec(in_stack_ffffffffffffff60);
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::Write( TPZStream &buf, int withclassid ) const
{
    TPZMatrix<TVar>::Write(buf,withclassid);
    buf.Write( fStorage);
    TPZVec<int64_t> skyl(this->Rows()+1,0);
    TVar *ptr = 0;
    if (this->Rows()) {
        ptr = &fStorage[0];
    }
    for (int64_t i=0; i<this->Rows()+1; i++) {
        skyl[i] = fElem[i] - ptr;
    }
    buf.Write( skyl);
}